

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stat_update(nni_stat *stat,nni_mtx **mtxp)

{
  nni_stat_item *pnVar1;
  nni_stat_info *pnVar2;
  char *__s2;
  int iVar3;
  uint64_t uVar4;
  char *pcVar5;
  nni_time nVar6;
  char *str;
  char *old;
  nni_stat_info *info;
  nni_stat_item *item;
  nni_mtx **mtxp_local;
  nni_stat *stat_local;
  
  pnVar1 = stat->s_item;
  pnVar2 = pnVar1->si_info;
  if (((byte)pnVar2->field_0x18 >> 2 & 1) == 0) {
    if (*mtxp != (nni_mtx *)0x0) {
      nni_mtx_unlock(*mtxp);
      *mtxp = (nni_mtx *)0x0;
    }
  }
  else {
    if (pnVar1->si_mtx == (nni_mtx *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/stats.c",
                0x126,"item->si_mtx != NULL");
    }
    if (*mtxp != pnVar1->si_mtx) {
      if (*mtxp != (nni_mtx *)0x0) {
        nni_mtx_unlock(*mtxp);
      }
      nni_mtx_lock(pnVar1->si_mtx);
      *mtxp = pnVar1->si_mtx;
    }
  }
  switch(pnVar2->si_type) {
  case NNG_STAT_SCOPE:
  case NNG_STAT_ID:
    (stat->s_val).sv_id = (pnVar1->si_u).sv_id;
    break;
  case NNG_STAT_LEVEL:
  case NNG_STAT_COUNTER:
    if ((pnVar2->field_0x18 & 1) == 0) {
      stat->s_val = (anon_union_8_4_c36a9d58_for_s_val)pnVar1->si_u;
    }
    else {
      uVar4 = nni_atomic_get64(&(pnVar1->si_u).sv_atomic);
      (stat->s_val).sv_value = uVar4;
    }
    break;
  case NNG_STAT_STRING:
    nni_mtx_lock(&stats_val_lock);
    __s2 = (stat->s_val).sv_string;
    pcVar5 = (pnVar1->si_u).sv_string;
    if (((((byte)pnVar2->field_0x18 >> 1 & 1) == 0) || (pcVar5 == (char *)0x0)) ||
       ((__s2 != (char *)0x0 && (iVar3 = strcmp(pcVar5,__s2), iVar3 == 0)))) {
      if (((byte)pnVar2->field_0x18 >> 1 & 1) == 0) {
        (stat->s_val).sv_string = pcVar5;
      }
      else {
        nni_strfree((stat->s_val).sv_string);
        (stat->s_val).sv_value = 0;
      }
    }
    else {
      pcVar5 = nni_strdup(pcVar5);
      (stat->s_val).sv_string = pcVar5;
      nni_strfree(__s2);
    }
    nni_mtx_unlock(&stats_val_lock);
    break;
  case NNG_STAT_BOOLEAN:
    (stat->s_val).sv_bool = (_Bool)((pnVar1->si_u).sv_bool & 1);
  }
  nVar6 = nni_clock();
  stat->s_timestamp = nVar6;
  return;
}

Assistant:

static void
stat_update(nni_stat *stat, nni_mtx **mtxp)
{
	const nni_stat_item *item = stat->s_item;
	const nni_stat_info *info = item->si_info;
	char                *old;
	char                *str;

	if (info->si_lock) {
		NNI_ASSERT(item->si_mtx != NULL);
		if (*mtxp != item->si_mtx) {
			if (*mtxp) {
				nni_mtx_unlock(*mtxp);
			}
			nni_mtx_lock(item->si_mtx);
			*mtxp = item->si_mtx;
		}
	} else if (*mtxp) {
		nni_mtx_unlock(*mtxp);
		*mtxp = NULL;
	}
	switch (info->si_type) {
	case NNG_STAT_SCOPE:
	case NNG_STAT_ID:
		stat->s_val.sv_id = item->si_u.sv_id;
		break;
	case NNG_STAT_BOOLEAN:
		stat->s_val.sv_bool = item->si_u.sv_bool;
		break;
	case NNG_STAT_COUNTER:
	case NNG_STAT_LEVEL:
		if (info->si_atomic) {
			stat->s_val.sv_value = nni_atomic_get64(
			    (nni_atomic_u64 *) &item->si_u.sv_atomic);
		} else {
			stat->s_val.sv_value = item->si_u.sv_number;
		}
		break;
	case NNG_STAT_STRING:
		nni_mtx_lock(&stats_val_lock);
		old = stat->s_val.sv_string;
		str = item->si_u.sv_string;

		// If we have to allocate a new string, do so.  But
		// only do it if new string is different.
		if ((info->si_alloc) && (str != NULL) &&
		    ((old == NULL) || (strcmp(str, old) != 0))) {

			stat->s_val.sv_string = nni_strdup(str);
			nni_strfree(old);

		} else if (info->si_alloc) {
			nni_strfree(stat->s_val.sv_string);
			stat->s_val.sv_string = NULL;

		} else {
			stat->s_val.sv_string = str;
		}
		nni_mtx_unlock(&stats_val_lock);
		break;
	}
	stat->s_timestamp = nni_clock();
}